

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O3

ND_UINT8 ShemuX86CountZeroBits(ND_UINT64 Value,ND_OPERAND_SIZE Size,ND_BOOL Forward)

{
  ND_UINT8 NVar1;
  uint uVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  
  uVar2 = Size * 8;
  if ((int)CONCAT71(in_register_00000011,Forward) == 0) {
    if (-1 < (int)(uVar2 - 1)) {
      NVar1 = '\0';
      do {
        if ((Value >> ((ulong)(byte)((char)uVar2 - 1) & 0x3f) & 1) != 0) {
          return NVar1;
        }
        NVar1 = NVar1 + '\x01';
        uVar2 = uVar2 - 1;
      } while (0 < (int)uVar2);
      return (char)Size << 3;
    }
  }
  else if (uVar2 != 0) {
    uVar3 = 0;
    do {
      if ((Value >> (uVar3 & 0x3f) & 1) != 0) {
        return (ND_UINT8)uVar3;
      }
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    return (char)Size << 3;
  }
  return '\0';
}

Assistant:

static ND_UINT8
ShemuX86CountZeroBits(
    ND_UINT64 Value,
    ND_OPERAND_SIZE Size,
    ND_BOOL Forward
    )
{
    ND_UINT8 cnt = 0;

    if (Forward)
    {
        for (ND_UINT32 i = 0; i < Size * 8 && ND_GET_BIT(i, Value) == 0; i++, cnt++);
    }
    else
    {
        for (ND_SINT32 i = Size * 8 - 1; i >= 0 && ND_GET_BIT(i, Value) == 0; i--, cnt++);
    }

    return cnt;
}